

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O3

void __thiscall xray_re::xr_way_object::save_v12(xr_way_object *this,xr_ini_writer *w)

{
  _Rb_tree_header *p_Var1;
  undefined2 uVar2;
  pointer pwVar3;
  pointer pwVar4;
  xr_way_object *pxVar5;
  size_t sVar6;
  _Base_ptr p_Var7;
  undefined2 uVar8;
  int iVar9;
  pointer point;
  size_t in_RCX;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  byte bVar12;
  void *__buf;
  uint32_t id;
  _Base_ptr p_Var13;
  ulong uVar14;
  pointer pwVar15;
  pointer pwVar16;
  dict indices;
  char buffer [128];
  pair<unsigned_short,_unsigned_char> local_f4;
  xr_way_object *local_f0;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  local_e8;
  char local_b8 [136];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  p_Var1 = &local_e8._M_impl.super__Rb_tree_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pwVar15 = (this->m_links).
            super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>._M_impl.
            super__Vector_impl_data._M_start;
  pwVar3 = (this->m_links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_f0 = this;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (pwVar15 != pwVar3) {
    do {
      uVar8 = pwVar15->from;
      p_Var11 = &p_Var1->_M_header;
      p_Var7 = local_e8._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_e8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00191b61:
        local_f4.second = '\0';
        local_f4.first = uVar8;
        std::
        _Rb_tree<unsigned_short,std::pair<unsigned_short_const,unsigned_char>,std::_Select1st<std::pair<unsigned_short_const,unsigned_char>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_char>>>
        ::_M_emplace_unique<std::pair<unsigned_short,unsigned_char>>
                  ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,unsigned_char>,std::_Select1st<std::pair<unsigned_short_const,unsigned_char>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_char>>>
                    *)&local_e8,&local_f4);
        uVar8 = pwVar15->from;
        uVar14 = 0;
      }
      else {
        do {
          p_Var13 = p_Var7;
          p_Var10 = p_Var11;
          uVar2 = (undefined2)p_Var13[1]._M_color;
          p_Var11 = p_Var13;
          if ((ushort)uVar2 < (ushort)uVar8) {
            p_Var11 = p_Var10;
          }
          p_Var7 = (&p_Var13->_M_left)[(ushort)uVar2 < (ushort)uVar8];
        } while ((&p_Var13->_M_left)[(ushort)uVar2 < (ushort)uVar8] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var11 == p_Var1) goto LAB_00191b61;
        if ((ushort)uVar2 < (ushort)uVar8) {
          p_Var13 = p_Var10;
        }
        if ((ushort)uVar8 < (ushort)(short)p_Var13[1]._M_color) goto LAB_00191b61;
        bVar12 = *(byte *)((long)&p_Var11[1]._M_color + 2) + 1;
        *(byte *)((long)&p_Var11[1]._M_color + 2) = bVar12;
        uVar14 = (ulong)bVar12;
      }
      in_RCX = (size_t)(ushort)uVar8;
      iVar9 = snprintf(local_b8,0x80,"link_wp_%d_%d",in_RCX,uVar14);
      if (0 < iVar9) {
        xr_ini_writer::write(w,(int)local_b8,__buf,in_RCX);
      }
      pwVar15 = pwVar15 + 1;
    } while (pwVar15 != pwVar3);
  }
  pxVar5 = local_f0;
  xr_ini_writer::write(w,0x1f38ef,(void *)(ulong)local_f0->m_type,in_RCX);
  xr_ini_writer::write(w,0x1f4f3d,(void *)0x13,in_RCX);
  point = (pxVar5->m_points).
          super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>._M_impl.
          super__Vector_impl_data._M_start;
  pwVar4 = (pxVar5->m_points).
           super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pwVar16 = point;
  if (point != pwVar4) {
    sVar6 = 0;
    do {
      in_RCX = sVar6;
      id = (uint32_t)in_RCX;
      write_point_ini::operator()((write_point_ini *)&local_f4,point,w,id);
      point = point + 1;
      sVar6 = (ulong)(id + 1);
    } while (point != pwVar4);
    point = (pxVar5->m_points).
            super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    pwVar16 = (pxVar5->m_points).
              super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  xr_ini_writer::write
            (w,0x1f40a5,(void *)(((long)point - (long)pwVar16 >> 3) * 0x6db6db6db6db6db7),in_RCX);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  ::~_Rb_tree(&local_e8);
  return;
}

Assistant:

void xr_way_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	// write links
	char buffer[128];
	char* buf = &buffer[0];
	typedef std::map<uint16_t, uint8_t> dict;
	typedef std::pair<uint16_t, uint8_t> dict_pair;
	dict indices;
	fvector2 link_vector;
	link_vector.y = 1.0;

	way_link_vec_cit it = m_links.begin(), end = m_links.end();
	for (uint8_t id = 0; it != end; ++it) {
		way_link* link = (way_link *)&(*it);

		dict::iterator pair = indices.find(link->from);
		if (pair != indices.end())
			id = ++pair->second;
		else
			indices.insert(dict_pair(link->from, id = 0));

		int n = xr_snprintf(buf, sizeof(buffer), "link_wp_%d_%d", link->from, id);
		if (n > 0)
		{
			link_vector.x = link->to;
			link_vector.y = link->weight;
			w->write(buf, link_vector);
		}
	}

	w->write("type", this->m_type);
	w->write("version", WAYOBJECT_VERSION);

	// write waypoints

	w->w_ini_seq(this->m_points, write_point_ini());
	w->write("wp_count", this->m_points.size());
}